

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_openelm::llm_build_openelm
          (llm_build_openelm *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  ggml_context *pgVar3;
  pointer plVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ggml_tensor *pgVar7;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar8;
  long lVar9;
  undefined8 uVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *cur;
  int il;
  uint32_t il_00;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long local_80;
  ggml_tensor *local_68;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 != plVar2->n_embd_head_k) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x24f4,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_68 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar7 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  local_80 = 0;
  for (lVar12 = 0; lVar12 < (this->super_llm_graph_context).n_layer; lVar12 = lVar12 + 1) {
    il_00 = (uint32_t)lVar12;
    uVar5 = llama_hparams::n_head((this->super_llm_graph_context).hparams,il_00);
    uVar6 = llama_hparams::n_head_kv((this->super_llm_graph_context).hparams,il_00);
    pgVar8 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,local_68,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->attn_norm + local_80),
                        (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"attn_norm",il_00);
    pgVar8 = llm_graph_context::build_lora_mm
                       (&this->super_llm_graph_context,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wqkv + local_80),pgVar8
                       );
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"wqkv",il_00);
    uVar13 = (ulong)uVar5;
    uVar14 = (ulong)uVar6;
    lVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar8,
                            (this->super_llm_graph_context).n_embd_head_k,uVar13 + uVar14 * 2,
                            (long)(this->super_llm_graph_context).n_tokens);
    pgVar3 = (this->super_llm_graph_context).ctx0;
    uVar10 = ggml_view_3d(pgVar3,lVar9,uVar1,uVar13,(long)(this->super_llm_graph_context).n_tokens,
                          *(undefined8 *)(lVar9 + 0x38),*(undefined8 *)(lVar9 + 0x40),0);
    pgVar8 = (ggml_tensor *)ggml_cont(pgVar3,uVar10);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Qcur",il_00);
    pgVar3 = (this->super_llm_graph_context).ctx0;
    uVar10 = ggml_view_3d(pgVar3,lVar9,uVar1,uVar14,(long)(this->super_llm_graph_context).n_tokens,
                          *(long *)(lVar9 + 0x38),*(undefined8 *)(lVar9 + 0x40),
                          *(long *)(lVar9 + 0x38) * uVar13);
    pgVar11 = (ggml_tensor *)ggml_cont(pgVar3,uVar10);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Kcur",il_00);
    pgVar3 = (this->super_llm_graph_context).ctx0;
    uVar10 = ggml_view_3d(pgVar3,lVar9,uVar1,uVar14,(long)(this->super_llm_graph_context).n_tokens,
                          *(long *)(lVar9 + 0x38),*(undefined8 *)(lVar9 + 0x40),
                          (uVar13 + uVar14) * *(long *)(lVar9 + 0x38));
    cur = (ggml_tensor *)ggml_cont(pgVar3,uVar10);
    llm_graph_context::cb(&this->super_llm_graph_context,cur,"Vcur",il_00);
    pgVar8 = llm_graph_context::build_norm
                       (&this->super_llm_graph_context,pgVar8,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->attn_q_norm + local_80)
                        ,(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Qcur",il_00);
    pgVar11 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar11,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->attn_k_norm + local_80
                          ),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Kcur",il_00);
    pgVar8 = (ggml_tensor *)
             ggml_rope_ext((this->super_llm_graph_context).freq_base,
                           (this->super_llm_graph_context).freq_scale,
                           (this->super_llm_graph_context).ext_factor,
                           (this->super_llm_graph_context).attn_factor,
                           (this->super_llm_graph_context).beta_fast,
                           (this->super_llm_graph_context).beta_slow,
                           (this->super_llm_graph_context).ctx0,pgVar8,pgVar7,0,
                           (int)(this->super_llm_graph_context).n_rot,
                           (this->super_llm_graph_context).rope_type,
                           (this->super_llm_graph_context).n_ctx_orig);
    pgVar11 = (ggml_tensor *)
              ggml_rope_ext((this->super_llm_graph_context).freq_base,
                            (this->super_llm_graph_context).freq_scale,
                            (this->super_llm_graph_context).ext_factor,
                            (this->super_llm_graph_context).attn_factor,
                            (this->super_llm_graph_context).beta_fast,
                            (this->super_llm_graph_context).beta_slow,
                            (this->super_llm_graph_context).ctx0,pgVar11,pgVar7,0,
                            (int)(this->super_llm_graph_context).n_rot,
                            (this->super_llm_graph_context).rope_type,
                            (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Qcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Kcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"Vcur",il_00);
    pgVar8 = llm_graph_context::build_attn
                       (&this->super_llm_graph_context,inp,gf,
                        *(ggml_tensor **)
                         ((long)&((model->layers).
                                  super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->wo + local_80),
                        (ggml_tensor *)0x0,pgVar8,pgVar11,cur,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                        1.0 / SQRT((float)uVar1),il_00);
    if (lVar12 == (this->super_llm_graph_context).n_layer + -1) {
      pgVar11 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
      local_68 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_68,pgVar11)
      ;
      pgVar8 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar8,pgVar11);
    }
    pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,local_68,pgVar8);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_inp",il_00);
    pgVar11 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar8,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ffn_norm + local_80),
                         (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_norm",il_00);
    plVar4 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pgVar11 = llm_graph_context::build_ffn
                        (&this->super_llm_graph_context,pgVar11,
                         *(ggml_tensor **)((long)&plVar4->ffn_up + local_80),(ggml_tensor *)0x0,
                         (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar4->ffn_gate + local_80),
                         (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                         *(ggml_tensor **)((long)&plVar4->ffn_down + local_80),(ggml_tensor *)0x0,
                         (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_out",il_00);
    pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar11,pgVar8);
    local_68 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar8,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,local_68,"l_out",il_00);
    local_80 = local_80 + 0x4f0;
  }
  pgVar7 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_68,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar7;
  pgVar7 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar7);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar7;
  ggml_build_forward_expand(gf,pgVar7);
  return;
}

Assistant:

llm_build_openelm(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;
        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            const int64_t n_head    = hparams.n_head(il);
            const int64_t n_head_kv = hparams.n_head_kv(il);
            const int64_t n_head_qkv = 2*n_head_kv + n_head;

            cur = inpL;
            ggml_tensor * residual = cur;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_reshape_3d(ctx0, cur, n_embd_head_k, n_head_qkv, n_tokens);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_3d(ctx0, cur, n_embd_head, n_head,    n_tokens, cur->nb[1], cur->nb[2], 0));
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_3d(ctx0, cur, n_embd_head, n_head_kv, n_tokens, cur->nb[1], cur->nb[2], cur->nb[1]*n_head));
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_3d(ctx0, cur, n_embd_head, n_head_kv, n_tokens, cur->nb[1], cur->nb[2], cur->nb[1]*(n_head+n_head_kv)));
                cb(Vcur, "Vcur", il);

                Qcur = build_norm(Qcur,
                        model.layers[il].attn_q_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(Qcur, "Qcur", il);

                Kcur = build_norm(Kcur,
                        model.layers[il].attn_k_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(Kcur, "Kcur", il);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, NULL,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, NULL,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Qcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                residual = ggml_get_rows(ctx0, residual, inp_out_ids);
                cur = ggml_get_rows(ctx0, cur, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, residual, cur);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            inpL = cur;
        }

        cur = inpL;

        // norm
        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }